

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::DrawRotatedDecal
          (PixelGameEngine *this,vf2d *pos,Decal *decal,float fAngle,vf2d *center,vf2d *scale,
          Pixel *tint)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  uint32_t uVar4;
  long lVar5;
  v2d_generic<float> vVar6;
  v2d_generic<float> vVar7;
  v2d_generic<float> vVar8;
  double dVar9;
  double dVar10;
  v2d_generic<float> vVar11;
  float fVar12;
  float fVar13;
  undefined1 local_c8 [8];
  undefined1 local_c0 [24];
  pointer pvStack_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_c0._0_16_ = ZEXT416(0);
  local_60._0_4_ = NORMAL;
  local_60._4_4_ = 0;
  local_c8 = (undefined1  [8])decal;
  unique0x100004cf = local_c0._0_16_;
  local_a0 = local_c0._0_16_;
  local_90 = local_c0._0_16_;
  local_80 = local_c0._0_16_;
  local_70 = local_c0._0_16_;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)local_c0,
             4);
  local_58 = 0;
  uStack_50 = 0x3f80000000000000;
  local_48 = 0x3f8000003f800000;
  uStack_40 = 0x3f800000;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>
            ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&pvStack_a8,
             &local_58);
  local_58 = 0x3f8000003f800000;
  uStack_50 = 0x3f8000003f800000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)local_90,&local_58);
  uVar4 = (tint->field_0).n;
  local_58 = CONCAT44(uVar4,uVar4);
  uStack_50 = CONCAT44(uVar4,uVar4);
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)(local_80 + 8),&local_58);
  local_60._4_4_ = 4;
  vVar6.x = (*scale).x * (0.0 - (*center).x);
  vVar6.y = (*scale).y * (0.0 - (*center).y);
  *(v2d_generic<float> *)local_c0._0_8_ = vVar6;
  vVar7.x = (*scale).x * (0.0 - (*center).x);
  vVar7.y = (*scale).y * ((float)decal->sprite->height - (*center).y);
  *(v2d_generic<float> *)(local_c0._0_8_ + 8) = vVar7;
  uVar1 = decal->sprite->width;
  uVar3 = decal->sprite->height;
  vVar11.x = (*scale).x * ((float)(int)uVar1 - (*center).x);
  vVar11.y = (*scale).y * ((float)(int)uVar3 - (*center).y);
  *(v2d_generic<float> *)(local_c0._0_8_ + 0x10) = vVar11;
  vVar8.x = (*scale).x * ((float)decal->sprite->width - (*center).x);
  vVar8.y = (*scale).y * (0.0 - (*center).y);
  *(v2d_generic<float> *)(local_c0._0_8_ + 0x18) = vVar8;
  dVar9 = cos((double)fAngle);
  dVar10 = sin((double)fAngle);
  lVar5 = 0;
  do {
    fVar12 = *(float *)((long)(float *)local_c0._0_8_ + lVar5 * 2);
    fVar13 = *(float *)((long)(local_c0._0_8_ + 4) + lVar5 * 2);
    *(ulong *)((long)(float *)local_c0._0_8_ + lVar5 * 2) =
         CONCAT44((*pos).y + fVar12 * (float)dVar10 + fVar13 * (float)dVar9,
                  (*pos).x + fVar12 * (float)dVar9 + -fVar13 * (float)dVar10);
    uVar2 = *(undefined8 *)((long)(float *)local_c0._0_8_ + lVar5 * 2);
    fVar12 = (this->vInvScreenSize).x * (float)uVar2;
    fVar13 = (this->vInvScreenSize).y * (float)((ulong)uVar2 >> 0x20);
    *(ulong *)((long)(float *)local_c0._0_8_ + lVar5 * 2) =
         CONCAT44(fVar13 + fVar13 + -1.0,fVar12 + fVar12 + -1.0);
    *(uint *)((long)(local_c0._0_8_ + 4) + lVar5 * 2) =
         *(uint *)((long)(local_c0._0_8_ + 4) + lVar5 * 2) ^ 0x80000000;
    *(undefined4 *)(local_90._0_8_ + lVar5) = 0x3f800000;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x10);
  local_60._0_4_ = this->nDecalMode;
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             (value_type *)local_c8);
  if ((pointer)local_80._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_80._8_8_,local_70._8_8_ - local_80._8_8_);
  }
  if ((pointer)local_90._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_90._0_8_,local_80._0_8_ - local_90._0_8_);
  }
  if (pvStack_a8 != (pointer)0x0) {
    operator_delete(pvStack_a8,local_a0._8_8_ - (long)pvStack_a8);
  }
  if ((pointer)local_c0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ - local_c0._0_8_);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawRotatedDecal(const olc::vf2d &pos, olc::Decal *decal, const float fAngle, const olc::vf2d &center, const olc::vf2d &scale, const olc::Pixel &tint)
	{
		DecalInstance di;
		di.decal = decal;
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		di.w = {1, 1, 1, 1};
		di.tint = {tint, tint, tint, tint};
		di.points = 4;
		di.pos[0] = (olc::vf2d(0.0f, 0.0f) - center) * scale;
		di.pos[1] = (olc::vf2d(0.0f, float(decal->sprite->height)) - center) * scale;
		di.pos[2] = (olc::vf2d(float(decal->sprite->width), float(decal->sprite->height)) - center) * scale;
		di.pos[3] = (olc::vf2d(float(decal->sprite->width), 0.0f) - center) * scale;
		float c = cos(fAngle), s = sin(fAngle);
		for (int i = 0; i < 4; i++)
		{
			di.pos[i] = pos + olc::vf2d(di.pos[i].x * c - di.pos[i].y * s, di.pos[i].x * s + di.pos[i].y * c);
			di.pos[i] = di.pos[i] * vInvScreenSize * 2.0f - olc::vf2d(1.0f, 1.0f);
			di.pos[i].y *= -1.0f;
			di.w[i] = 1;
		}
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}